

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O2

int Wlc_ObjHasArithmFanins(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Wlc_Obj_t *pObj_00;
  
  iVar1 = Wlc_ObjHasArithm_rec(p,pObj);
  if (iVar1 != 0) {
    __assert_fail("!Wlc_ObjHasArithm_rec(p, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcWin.c"
                  ,0x51,"int Wlc_ObjHasArithmFanins(Wlc_Ntk_t *, Wlc_Obj_t *)");
  }
  iVar1 = 0;
  do {
    if ((int)pObj->nFanins <= iVar1) {
      return 0;
    }
    iVar2 = Wlc_ObjFaninId(pObj,iVar1);
    pObj_00 = Wlc_NtkObj(p,iVar2);
    iVar2 = Wlc_ObjHasArithm_rec(p,pObj_00);
    iVar1 = iVar1 + 1;
  } while (iVar2 == 0);
  return 1;
}

Assistant:

int Wlc_ObjHasArithmFanins( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    Wlc_Obj_t * pFanin;  int i;
    assert( !Wlc_ObjHasArithm_rec(p, pObj) );
    Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
        if ( Wlc_ObjHasArithm_rec(p, pFanin) )
            return 1;
    return 0;
}